

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O3

void Zyx_ManSetupVars(Zyx_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  word *pwVar4;
  
  if (p->pPars->fMajority == 0) {
    pwVar4 = p->pTruth;
    iVar1 = p->nObjs;
  }
  else {
    iVar1 = p->nObjs;
    uVar2 = p->nWords * iVar1;
    if (((int)uVar2 < 0) || (p->vInfo->nSize <= (int)uVar2)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
    }
    pwVar4 = p->vInfo->pArray + uVar2;
  }
  uVar2 = p->pPars->nVars;
  if ((int)uVar2 < iVar1) {
    do {
      Zyx_SetConstVar(p,(uVar2 - p->pPars->nVars) * (p->LutMask + 1),0);
      uVar2 = uVar2 + 1;
      iVar1 = p->nObjs;
    } while ((int)uVar2 < iVar1);
    uVar2 = p->pPars->nVars;
  }
  if ((int)uVar2 < iVar1) {
    do {
      uVar3 = uVar2;
      if ((int)uVar2 < iVar1) {
        do {
          Zyx_SetConstVar(p,(uVar2 - p->pPars->nVars) * iVar1 + p->TopoBase + uVar3,0);
          uVar3 = uVar3 + 1;
          iVar1 = p->nObjs;
        } while ((int)uVar3 < iVar1);
      }
      uVar2 = uVar2 + 1;
    } while ((int)uVar2 < iVar1);
    uVar2 = p->pPars->nVars;
  }
  Zyx_SetConstVar(p,(~uVar2 + iVar1) * iVar1 + p->TopoBase + iVar1 + -2,1);
  iVar1 = p->pPars->nVars;
  if (p->pPars->fMajority != 0) {
    if (iVar1 < 1) goto LAB_005ae389;
    uVar2 = 0;
    do {
      Zyx_SetConstVar(p,p->TopoBase + uVar2,(uint)(uVar2 < 3));
      uVar2 = uVar2 + 1;
      iVar1 = p->pPars->nVars;
    } while ((int)uVar2 < iVar1);
  }
  if (iVar1 == 0x1f) {
    return;
  }
LAB_005ae389:
  uVar2 = 0;
  do {
    if (0 < iVar1) {
      uVar3 = 0;
      do {
        Zyx_SetConstVar(p,p->nObjs * uVar2 + p->MintBase + uVar3,
                        (uint)((uVar2 >> (uVar3 & 0x1f) & 1) != 0));
        uVar3 = uVar3 + 1;
      } while ((int)uVar3 < p->pPars->nVars);
    }
    Zyx_SetConstVar(p,p->nObjs * uVar2 + p->nObjs + p->MintBase + -1,
                    (uint)((pwVar4[uVar2 >> 6] >> ((ulong)uVar2 & 0x3f) & 1) != 0));
    uVar2 = uVar2 + 1;
    iVar1 = p->pPars->nVars;
  } while ((int)uVar2 < 1 << ((byte)iVar1 & 0x1f));
  return;
}

Assistant:

void Zyx_ManSetupVars( Zyx_Man_t * p )
{
    int i, k, m;
    word * pSpec = p->pPars->fMajority ? Zyx_ManTruth(p, p->nObjs) : p->pTruth;
    // set unused functionality vars to 0
    for ( i = p->pPars->nVars; i < p->nObjs; i++ )
        Zyx_SetConstVar( p, Zyx_FuncVar(p, i, 0), 0 );
    // set unused topology vars
    for ( i = p->pPars->nVars; i < p->nObjs; i++ )
        for ( k = i; k < p->nObjs; k++ )
            Zyx_SetConstVar( p, Zyx_TopoVar(p, i, k), 0 );
    // connect topmost node
    Zyx_SetConstVar( p, Zyx_TopoVar(p, p->nObjs-1, p->nObjs-2), 1 );
    // connect first node
    if ( p->pPars->fMajority )
        for ( k = 0; k < p->pPars->nVars; k++ )
            Zyx_SetConstVar( p, Zyx_TopoVar(p, p->pPars->nVars, k), k < 3 );
    // set minterm vars
    for ( m = 0; m < (1 << p->pPars->nVars); m++ )
    {
        for ( i = 0; i < p->pPars->nVars; i++ )
            Zyx_SetConstVar( p, Zyx_MintVar(p, m, i), (m >> i) & 1 );
        Zyx_SetConstVar( p, Zyx_MintVar(p, m, p->nObjs-1), Abc_TtGetBit(pSpec, m) );
    }
}